

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_geometry.cpp
# Opt level: O0

bool __thiscall ON_Geometry::SwapCoordinates(ON_Geometry *this,int i,int j)

{
  int iVar1;
  double *pdVar2;
  undefined1 local_a8 [8];
  ON_Xform swapij;
  int k;
  int dim;
  bool rc;
  int j_local;
  int i_local;
  ON_Geometry *this_local;
  
  k._3_1_ = false;
  iVar1 = (*(this->super_ON_Object)._vptr_ON_Object[0x18])();
  if ((((0 < iVar1) && (iVar1 < 4)) && (-1 < i)) && (((i < 3 && (-1 < j)) && (j < 3)))) {
    if (i == j) {
      k._3_1_ = true;
    }
    else {
      memcpy(local_a8,&ON_Xform::ZeroTransformation,0x80);
      for (swapij.m_xform[3][3]._4_4_ = 0; swapij.m_xform[3][3]._4_4_ < 4;
          swapij.m_xform[3][3]._4_4_ = swapij.m_xform[3][3]._4_4_ + 1) {
        if (i == swapij.m_xform[3][3]._4_4_) {
          pdVar2 = ON_Xform::operator[]((ON_Xform *)local_a8,swapij.m_xform[3][3]._4_4_);
          pdVar2[j] = 1.0;
        }
        else if (j == swapij.m_xform[3][3]._4_4_) {
          pdVar2 = ON_Xform::operator[]((ON_Xform *)local_a8,swapij.m_xform[3][3]._4_4_);
          pdVar2[i] = 1.0;
        }
        else {
          pdVar2 = ON_Xform::operator[]((ON_Xform *)local_a8,swapij.m_xform[3][3]._4_4_);
          pdVar2[swapij.m_xform[3][3]._4_4_] = 1.0;
        }
      }
      iVar1 = (*(this->super_ON_Object)._vptr_ON_Object[0x1c])(this,local_a8);
      k._3_1_ = (bool)((byte)iVar1 & 1);
    }
  }
  return k._3_1_;
}

Assistant:

bool ON_Geometry::SwapCoordinates(
      int i, int j        // indices of coords to swap
      )
{
  bool rc = false;
  const int dim = Dimension();
  if ( dim > 0 && dim <= 3 && i >= 0 && i < 3 && j >= 0 && j < 3 ) {
    if ( i == j ) {
      rc = true;
    }
    else {
      int k;
      ON_Xform swapij(ON_Xform::ZeroTransformation);
      for ( k = 0; k < 4; k++ ) {
        if ( i == k )
          swapij[k][j] = 1.0;
        else if ( j == k )
          swapij[k][i] = 1.0;
        else
          swapij[k][k] = 1.0;
      }
      rc = Transform( swapij );
    }
  }
  return rc;
}